

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_muls_16_di(void)

{
  uint uVar1;
  uint uVar2;
  uint res;
  uint *r_dst;
  
  uVar1 = m68ki_cpu.ir >> 9;
  uVar2 = OPER_AY_DI_16();
  m68ki_cpu.not_z_flag = (int)(short)uVar2 * (int)(short)m68ki_cpu.dar[uVar1 & 7];
  m68ki_cpu.dar[uVar1 & 7] = m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_muls_16_di(void)
{
	uint* r_dst = &DX;
	uint res = MASK_OUT_ABOVE_32(MAKE_INT_16(OPER_AY_DI_16()) * MAKE_INT_16(MASK_OUT_ABOVE_16(*r_dst)));

	*r_dst = res;

	FLAG_Z = res;
	FLAG_N = NFLAG_32(res);
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}